

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O1

void ncnn::resize_bilinear_yuv420sp(uchar *src,int srcw,int srch,uchar *dst,int w,int h)

{
  resize_bilinear_c1(src,srcw,srch,srcw,dst,w,h,w);
  resize_bilinear_c2(src + srch * srcw,srcw / 2,srch / 2,srcw - (srcw >> 0x1f) & 0xfffffffe,
                     dst + h * w,w / 2,h / 2,w - (w >> 0x1f) & 0xfffffffe);
  return;
}

Assistant:

void resize_bilinear_yuv420sp(const unsigned char* src, int srcw, int srch, unsigned char* dst, int w, int h)
{
    // assert srcw % 2 == 0
    // assert srch % 2 == 0
    // assert w % 2 == 0
    // assert h % 2 == 0

    const unsigned char* srcY = src;
    unsigned char* dstY = dst;
    resize_bilinear_c1(srcY, srcw, srch, dstY, w, h);

    const unsigned char* srcUV = src + srcw * srch;
    unsigned char* dstUV = dst + w * h;
    resize_bilinear_c2(srcUV, srcw / 2, srch / 2, dstUV, w / 2, h / 2);
}